

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb_tree.c
# Opt level: O2

_Bool rotate_l(hb_tree *tree,hb_node *q)

{
  hb_node *phVar1;
  ulong uVar2;
  hb_node *phVar3;
  ulong uVar4;
  
  uVar4 = (q->field_2).bal;
  if ((uVar4 & 1) != 0) {
    phVar1 = q->rlink;
    uVar4 = uVar4 & 0xfffffffffffffffc;
    uVar2 = (phVar1->field_2).bal;
    phVar3 = phVar1->llink;
    (q->field_2).bal = (ulong)((uVar2 & 3) == 0) | (ulong)phVar1;
    q->rlink = phVar3;
    if (phVar3 != (hb_node *)0x0) {
      (phVar3->field_2).bal = (ulong)((uint)(phVar3->field_2).bal & 3) | (ulong)q;
    }
    (phVar1->field_2).pptr = (hb_node *)(uVar4 + (ulong)((uVar2 & 3) == 0) * 2);
    phVar1->llink = q;
    if (uVar4 != 0) {
      tree = (hb_tree *)(uVar4 + 0x20);
      if (*(hb_node **)(uVar4 + 0x18) == q) {
        tree = (hb_tree *)(uVar4 + 0x18);
      }
    }
    tree->root = phVar1;
    return (uVar2 & 3) == 0;
  }
  fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/hb_tree.c"
          ,0xac,"rotate_l","BAL_POS(q)",uVar4);
  abort();
}

Assistant:

static bool
rotate_l(hb_tree* restrict const tree, hb_node* restrict const q)
{
    hb_node* restrict const qp = PARENT(q);
    hb_node* restrict const qr = q->rlink;

    ASSERT(BAL_POS(q));

    hb_node *restrict const qrl = qr->llink;
    const int qr_bal = qr->bal & BAL_MASK;

    /* q->parent <- qr; q->bal <- (qr_bal == 0); */
    q->bal = (intptr_t)qr | (qr_bal == 0);
    if ((q->rlink = qrl) != NULL)
	qrl->bal = (intptr_t)q | (qrl->bal & BAL_MASK); /* qrl->parent <- q; */

    /* qr->parent <- qp; qr->bal <- -(qr_bal == 0); */
    qr->bal = (intptr_t)qp | ((qr_bal == 0) << 1);
    qr->llink = q;
    *(qp == NULL ? &tree->root : qp->llink == q ? &qp->llink : &qp->rlink) = qr;

    return (qr_bal == 0);
}